

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HubContext.cpp
# Opt level: O0

error_code __thiscall
SL::WS_LITE::TLSContext::set_default_verify_paths(TLSContext *this,error_code *ec)

{
  bool bVar1;
  element_type *peVar2;
  __shared_ptr_access<SL::WS_LITE::ThreadContext,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00
  ;
  element_type *peVar3;
  error_code eVar4;
  error_code eVar5;
  undefined4 uStack_54;
  shared_ptr<SL::WS_LITE::ThreadContext> *a;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<SL::WS_LITE::ThreadContext>,_std::allocator<std::shared_ptr<SL::WS_LITE::ThreadContext>_>_>
  *__range2;
  error_code *ec_local;
  TLSContext *this_local;
  error_code e;
  
  std::error_code::error_code((error_code *)&this_local);
  peVar2 = std::
           __shared_ptr_access<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->HubContext_);
  __end2 = std::
           vector<std::shared_ptr<SL::WS_LITE::ThreadContext>,_std::allocator<std::shared_ptr<SL::WS_LITE::ThreadContext>_>_>
           ::begin(&peVar2->ThreadContexts);
  a = (shared_ptr<SL::WS_LITE::ThreadContext> *)
      std::
      vector<std::shared_ptr<SL::WS_LITE::ThreadContext>,_std::allocator<std::shared_ptr<SL::WS_LITE::ThreadContext>_>_>
      ::end(&peVar2->ThreadContexts);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::shared_ptr<SL::WS_LITE::ThreadContext>_*,_std::vector<std::shared_ptr<SL::WS_LITE::ThreadContext>,_std::allocator<std::shared_ptr<SL::WS_LITE::ThreadContext>_>_>_>
                                *)&a);
    if (!bVar1) break;
    this_00 = (__shared_ptr_access<SL::WS_LITE::ThreadContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)__gnu_cxx::
                 __normal_iterator<std::shared_ptr<SL::WS_LITE::ThreadContext>_*,_std::vector<std::shared_ptr<SL::WS_LITE::ThreadContext>,_std::allocator<std::shared_ptr<SL::WS_LITE::ThreadContext>_>_>_>
                 ::operator*(&__end2);
    peVar3 = std::
             __shared_ptr_access<SL::WS_LITE::ThreadContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(this_00);
    eVar4 = asio::ssl::context::set_default_verify_paths(&peVar3->context,ec);
    e._0_8_ = eVar4._M_cat;
    this_local = (TLSContext *)CONCAT44(uStack_54,eVar4._M_value);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<SL::WS_LITE::ThreadContext>_*,_std::vector<std::shared_ptr<SL::WS_LITE::ThreadContext>,_std::allocator<std::shared_ptr<SL::WS_LITE::ThreadContext>_>_>_>
    ::operator++(&__end2);
  }
  eVar5._0_8_ = (ulong)this_local & 0xffffffff;
  eVar5._M_cat = (error_category *)e._0_8_;
  return eVar5;
}

Assistant:

virtual std::error_code set_default_verify_paths(std::error_code &ec) override
        {
#if WIN32
            HCERTSTORE hStore = CertOpenSystemStore(0, "ROOT");
            if (hStore != NULL) {

                X509_STORE *store = X509_STORE_new();
                PCCERT_CONTEXT pContext = NULL;
                while ((pContext = CertEnumCertificatesInStore(hStore, pContext)) != NULL) {
                    // convert from DER to internal format
                    X509 *x509 = d2i_X509(NULL, (const unsigned char **)&pContext->pbCertEncoded, pContext->cbCertEncoded);
                    if (x509 != NULL) {
                        X509_STORE_add_cert(store, x509);
                        X509_free(x509);
                    }
                }

                CertFreeCertificateContext(pContext);
                CertCloseStore(hStore, 0);

                // attach X509_STORE to boost ssl context
                for (auto &a : HubContext_->ThreadContexts) {
                    SSL_CTX_set_cert_store(a->context.native_handle(), store);
                }
            }
#endif
            std::error_code e;
            for (auto &a : HubContext_->ThreadContexts) {
                e = a->context.set_default_verify_paths(ec);
            }
            return e;
        }